

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O0

int libssh2_knownhost_get
              (LIBSSH2_KNOWNHOSTS *hosts,libssh2_knownhost **ext,libssh2_knownhost *oprev)

{
  libssh2_knownhost *plVar1;
  known_host *prev;
  known_host *node;
  libssh2_knownhost *oprev_local;
  libssh2_knownhost **ext_local;
  LIBSSH2_KNOWNHOSTS *hosts_local;
  
  if ((oprev == (libssh2_knownhost *)0x0) || (oprev->node == (void *)0x0)) {
    prev = (known_host *)_libssh2_list_first(&hosts->head);
  }
  else {
    prev = (known_host *)_libssh2_list_next((list_node *)oprev->node);
  }
  if (prev != (known_host *)0x0) {
    plVar1 = knownhost_to_external(prev);
    *ext = plVar1;
  }
  hosts_local._4_4_ = (uint)(prev == (known_host *)0x0);
  return hosts_local._4_4_;
}

Assistant:

LIBSSH2_API int
libssh2_knownhost_get(LIBSSH2_KNOWNHOSTS *hosts,
                      struct libssh2_knownhost **ext,
                      struct libssh2_knownhost *oprev)
{
    struct known_host *node;
    if(oprev && oprev->node) {
        /* we have a starting point */
        struct known_host *prev = oprev->node;

        /* get the next node in the list */
        node = _libssh2_list_next(&prev->node);

    }
    else
        node = _libssh2_list_first(&hosts->head);

    if(!node)
        /* no (more) node */
        return 1;

    *ext = knownhost_to_external(node);

    return 0;
}